

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_utils.h
# Opt level: O2

uint32_t __thiscall
cubeb_resampler_speex_one_way<short>::input_needed_for_output
          (cubeb_resampler_speex_one_way<short> *this,int32_t output_frame_count)

{
  uint32_t uVar1;
  ulong uVar2;
  float fVar3;
  
  uVar2 = (ulong)(this->super_processor).channels;
  uVar1 = 0;
  fVar3 = (float)(output_frame_count - (int)((this->resampling_in_buffer).length_ / uVar2)) *
          this->resampling_ratio - (float)(int)((this->resampling_out_buffer).length_ / uVar2);
  if (0.0 <= fVar3) {
    fVar3 = ceilf(fVar3);
    uVar1 = (uint32_t)(long)fVar3;
  }
  return uVar1;
}

Assistant:

size_t length() const { return length_; }